

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_3> * __thiscall
tcu::refract<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *i,
          Vector<double,_3> *n,double eta)

{
  int i_1;
  long lVar1;
  Vector<double,_3> *res_3;
  double dVar2;
  double res;
  double dVar3;
  Vector<double,_3> res_2;
  Vector<double,_3> res_1;
  double local_48 [4];
  double local_28 [3];
  
  dVar3 = 0.0;
  lVar1 = 0;
  do {
    dVar3 = dVar3 + i->m_data[lVar1] * *(double *)(this + lVar1 * 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  dVar2 = 1.0 - eta * eta * (1.0 - dVar3 * dVar3);
  if (0.0 <= dVar2) {
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    lVar1 = 0;
    do {
      local_28[lVar1] = *(double *)(this + lVar1 * 8) * eta;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    if (dVar2 < 0.0) {
      dVar2 = ::sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    lVar1 = 0;
    do {
      local_48[lVar1] = i->m_data[lVar1] * (eta * dVar3 + dVar2);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
    lVar1 = 0;
    do {
      __return_storage_ptr__->m_data[lVar1] = local_28[lVar1] - local_48[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}